

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)1>(Thread *this)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Value value;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  Value local_18;
  
  local_18 = Pop(this);
  value._8_8_ = local_18._8_8_;
  lVar2 = 0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    uVar1 = *(undefined4 *)((long)&local_18 + lVar2 * 2);
    auVar5._4_4_ = uVar1;
    auVar5._0_4_ = uVar1;
    auVar5._8_4_ = uVar1;
    auVar5._12_4_ = uVar1;
    auVar5 = pshufhw(auVar5,auVar5,0x55);
    auVar6._0_2_ = -(ushort)(auVar5._0_2_ == 0);
    auVar6._2_2_ = -(ushort)(auVar5._2_2_ == 0);
    auVar6._4_2_ = -(ushort)(auVar5._4_2_ == 0);
    auVar6._6_2_ = -(ushort)(auVar5._6_2_ == 0);
    auVar6._8_2_ = -(ushort)(auVar5._8_2_ == 0);
    auVar6._10_2_ = -(ushort)(auVar5._10_2_ == 0);
    auVar6._12_2_ = -(ushort)(auVar5._12_2_ == 0);
    auVar6._14_2_ = -(ushort)(auVar5._14_2_ == 0);
    lVar3 = lVar3 + SUB168(~auVar6 & _DAT_00282590,0);
    lVar4 = lVar4 + SUB168(~auVar6 & _DAT_00282590,8);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 8);
  value.i64_._1_7_ = 0;
  value.v128_.v[0] = lVar4 + lVar3 != 0;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}